

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void __thiscall
TPZTensor<TFad<6,_double>_>::EigenSystem
          (TPZTensor<TFad<6,_double>_> *this,TPZDecomposed *eigensystem)

{
  TFad<6,_double> *pTVar1;
  TPZTensor<TFad<6,_double>_> *pTVar2;
  ulong uVar3;
  int **ppiVar4;
  int *piVar5;
  TFad<6,_double> *pTVar6;
  TPZStack<int,_3> *__range2;
  long lVar7;
  ulong uVar8;
  TFad<6,_double> *pTVar9;
  int i_1;
  TFad<6,_double> *pTVar10;
  ulong uVar11;
  ulong uVar12;
  int *piVar13;
  uint i;
  long lVar14;
  TPZStack<int,_3> indices_to_add;
  TPZTensor<TFad<6,_double>_> sum;
  TPZVec<int> local_208;
  int local_1e8 [4];
  TPZTensor<TFad<6,_double>_> local_1d8;
  
  Norm((TFad<6,_double> *)&local_1d8,this);
  ComputeEigenvectors(this,eigensystem);
  lVar14 = 0;
  TPZVec<int>::TPZVec(&local_208,0);
  local_208.fNElements = 0;
  local_208.fNAlloc = 0;
  local_208._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189f4c8;
  local_208.fStore = local_1e8;
  do {
    if ((eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore[lVar14] != 1) {
      (*local_208._vptr_TPZVec[3])(&local_208);
      local_208.fStore[local_208.fNElements + -1] = (int)lVar14;
    }
    pTVar1 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.fStore
             [lVar14].super_TPZVec<TFad<6,_double>_>.fStore;
    pTVar9 = (eigensystem->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore[lVar14].
             fData.super_TPZVec<TFad<6,_double>_>.fStore;
    uVar8 = 0;
    pTVar6 = pTVar1;
    do {
      pTVar10 = pTVar6;
      uVar11 = uVar8;
      do {
        uVar12 = (5 - uVar11) * uVar11;
        uVar3 = uVar8;
        if (uVar8 <= uVar11) {
          uVar12 = (5 - uVar8) * uVar8;
          uVar3 = uVar11;
        }
        lVar7 = 2;
        do {
          pTVar9[uVar3].dx_[(uVar12 & 0x7fffffffffffffe) * 4 + lVar7 + -2] =
               pTVar6->dx_[lVar7 + -2] * pTVar1[uVar11].val_ +
               pTVar10->dx_[lVar7 + -2] * pTVar1[uVar8].val_;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 8);
        pTVar9[uVar3].dx_[(uVar12 & 0x7fffffffffffffe) * 4 + -1] =
             pTVar1[uVar8].val_ * pTVar1[uVar11].val_;
        uVar11 = uVar11 + 1;
        pTVar10 = pTVar10 + 1;
      } while (uVar11 != 3);
      uVar8 = uVar8 + 1;
      pTVar6 = pTVar6 + 1;
    } while (uVar8 != 3);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  if (0 < local_208.fNElements) {
    TPZTensor(&local_1d8);
    ppiVar4 = TPZVec<int>::begin(&local_208);
    piVar13 = *ppiVar4;
    piVar5 = TPZVec<int>::end(&local_208);
    if (piVar13 != piVar5) {
      pTVar2 = (eigensystem->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore;
      do {
        pTVar1 = pTVar2[*piVar13].fData.super_TPZVec<TFad<6,_double>_>.fStore;
        lVar14 = 0;
        pTVar9 = pTVar1;
        pTVar6 = local_1d8.fData.super_TPZVec<TFad<6,_double>_>.fStore;
        do {
          lVar7 = 2;
          do {
            pTVar6->dx_[lVar7 + -2] = pTVar9->dx_[lVar7 + -2] + pTVar6->dx_[lVar7 + -2];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 8);
          local_1d8.fData.super_TPZVec<TFad<6,_double>_>.fStore[lVar14].val_ =
               pTVar1[lVar14].val_ +
               local_1d8.fData.super_TPZVec<TFad<6,_double>_>.fStore[lVar14].val_;
          lVar14 = lVar14 + 1;
          pTVar6 = pTVar6 + 1;
          pTVar9 = pTVar9 + 1;
        } while (lVar14 != 6);
        piVar13 = piVar13 + 1;
      } while (piVar13 != piVar5);
    }
    ppiVar4 = TPZVec<int>::begin(&local_208);
    piVar13 = *ppiVar4;
    piVar5 = TPZVec<int>::end(&local_208);
    if (piVar13 != piVar5) {
      do {
        TPZManVector<TFad<6,_double>,_6>::operator=
                  (&(eigensystem->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore
                    [*piVar13].fData,&local_1d8.fData);
        piVar13 = piVar13 + 1;
      } while (piVar13 != piVar5);
    }
    local_1d8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_0189f120;
    TPZManVector<TFad<6,_double>,_6>::~TPZManVector(&local_1d8.fData);
  }
  if (local_208.fStore == local_1e8) {
    local_208.fStore = (int *)0x0;
  }
  local_208.fNAlloc = 0;
  local_208._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_208.fStore != (int *)0x0) {
    operator_delete__(local_208.fStore);
  }
  return;
}

Assistant:

void TPZTensor<T>::EigenSystem(TPZDecomposed &eigensystem)const {
    TPZManVector<T, 3> &eigenvalues = eigensystem.fEigenvalues;
    TPZManVector<TPZTensor<T>, 3> &eigentensors = eigensystem.fEigentensors;

    T precision;
    ZeroTolerance(precision);
    T tol = Norm()*precision;
    ComputeEigenvectors(eigensystem);

    TPZStack<int, 3> indices_to_add;
    for (unsigned int i = 0; i < 3; ++i) {
        if (eigensystem.fGeometricMultiplicity[i] != 1) {
            indices_to_add.push_back(i);
        }
        for (unsigned int j = 0; j < 3; ++j) {
            for (unsigned int k = j; k < 3; ++k) {
                eigentensors[i](j, k) = eigensystem.fEigenvectors[i][j] * eigensystem.fEigenvectors[i][k];
            }
        }
    }
    if (indices_to_add.size() > 0) {
        TPZTensor<T> sum;
        for (auto i : indices_to_add) {
            sum += eigentensors[i];
        }
        for (auto i : indices_to_add) {
            eigentensors[i] = sum;
        }
    }
#ifdef PZDEBUG
    TPZTensor<T> total;
    unsigned int i;
    for (i = 0; i < 3; i += eigensystem.fGeometricMultiplicity[i]) {
        total.Add(eigentensors[i], eigenvalues[i]);
    }
    if (i != 3) {
        std::cout << "Tensor decomposition error: " << std::endl;
        std::cout << "Incorrect total geometric multiplicity: " << i << std::endl;
        DebugStop();
    }
    for (unsigned int i = 0; i < 6; ++i) {
        if (!AreEqual(total[i], this->operator[](i), tol)) {
            std::cout << std::setprecision(15);
            std::cout << "Tensor decomposition error: " << std::endl;
            std::cout << "Original Tensor: ";
            this->Print(std::cout);
            std::cout << "Reconstruction from decomposition: ";
            total.Print(std::cout);
            std::cout << "Decomposition: " << std::endl;
            eigensystem.Print(std::cout);
            DebugStop();
        }
    }
#endif
}